

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkTestTools.cpp
# Opt level: O1

bool test::SendPreconnectData(SDKConnection *connection)

{
  ostringstream *poVar1;
  SDKResult SVar2;
  char *pcVar3;
  OutputWorker *pOVar4;
  bool bVar5;
  string Hello;
  uint8_t hello [1401];
  char *local_770;
  long local_768;
  char local_760 [16];
  undefined1 *local_750;
  long local_748;
  undefined1 local_740 [16];
  undefined1 local_730 [392];
  undefined1 local_5a8;
  undefined1 local_5a7 [1415];
  
  memset(&local_5a8,0,0x579);
  local_5a8 = 5;
  local_750 = local_740;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_750,"Pre-connect message","");
  memcpy(local_5a7,local_750,local_748 + 1);
  FunctionTimer::BeginCall((FunctionTimer *)t_tonk_send);
  SVar2 = tonk::SDKConnection::Send(connection,&local_5a8,local_748 + 2,0x32);
  FunctionTimer::EndCall((FunctionTimer *)t_tonk_send);
  if (SVar2.Result == Tonk_Success) {
    FunctionTimer::BeginCall((FunctionTimer *)t_tonk_send);
    SVar2 = tonk::SDKConnection::Send(connection,PreConnectData,10,0x37);
    FunctionTimer::EndCall((FunctionTimer *)t_tonk_send);
    if (SVar2.Result == Tonk_Success) {
      if (DAT_001bd6d8 < 2) {
        poVar1 = (ostringstream *)(local_730 + 0x10);
        local_730._0_8_ = Logger;
        local_730._8_4_ = Debug;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,DAT_001bd708,DAT_001bd710);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Sent preconnect data",0x14);
        pOVar4 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_730);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_730 + 0x80));
      }
      FunctionTimer::BeginCall((FunctionTimer *)t_tonk_flush);
      tonk::SDKConnection::Flush(connection);
      bVar5 = true;
      FunctionTimer::EndCall((FunctionTimer *)t_tonk_flush);
      goto LAB_00111672;
    }
    pcVar3 = tonk_result_to_string(SVar2.Result);
    std::__cxx11::string::string((string *)&local_770,pcVar3,(allocator *)local_730);
    if (DAT_001bd6d8 < 5) {
      poVar1 = (ostringstream *)(local_730 + 0x10);
      local_730._0_8_ = Logger;
      local_730._8_4_ = Error;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,DAT_001bd708,DAT_001bd710);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"tonk_send 2 failed: ",0x14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_770,local_768);
      pOVar4 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_730);
      goto LAB_00111641;
    }
  }
  else {
    pcVar3 = tonk_result_to_string(SVar2.Result);
    std::__cxx11::string::string((string *)&local_770,pcVar3,(allocator *)local_730);
    if (DAT_001bd6d8 < 5) {
      poVar1 = (ostringstream *)(local_730 + 0x10);
      local_730._0_8_ = Logger;
      local_730._8_4_ = Error;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,DAT_001bd708,DAT_001bd710);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"tonk_send 1 failed: ",0x14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_770,local_768);
      pOVar4 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_730);
LAB_00111641:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_730 + 0x10));
      std::ios_base::~ios_base((ios_base *)(local_730 + 0x80));
    }
  }
  if (local_770 != local_760) {
    operator_delete(local_770);
  }
  bVar5 = false;
LAB_00111672:
  if (local_750 != local_740) {
    operator_delete(local_750);
  }
  return bVar5;
}

Assistant:

bool SendPreconnectData(tonk::SDKConnection* connection)
{
    uint8_t hello[1 + 1400] = {};
    hello[0] = ID_ConnectionRebroadcast;
    std::string Hello = "Pre-connect message";
    memcpy(hello + 1, Hello.c_str(), Hello.length() + 1);

    t_tonk_send.BeginCall();
    tonk::SDKResult result = connection->Send(hello, 1 + Hello.length() + 1, TonkChannel_Reliable0);
    t_tonk_send.EndCall();

    if (!result)
    {
        Logger.Error("tonk_send 1 failed: ", result.ToString());
        return false;
    }

    t_tonk_send.BeginCall();
    result = connection->Send(PreConnectData, kPreConnectDataBytes, kPreConnectChannel);
    t_tonk_send.EndCall();

    if (!result)
    {
        Logger.Error("tonk_send 2 failed: ", result.ToString());
        return false;
    }

    Logger.Debug("Sent preconnect data");

    t_tonk_flush.BeginCall();
    connection->Flush();
    t_tonk_flush.EndCall();

    return true;
}